

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O1

int CVApolynomialMalloc(CVodeMem cv_mem)

{
  CVadjMemRec *pCVar1;
  CVdtpntMemRec **ppCVar2;
  undefined8 *puVar3;
  bool bVar4;
  N_Vector p_Var5;
  N_Vector *pp_Var6;
  long *__ptr;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  
  pCVar1 = cv_mem->cv_adj_mem;
  p_Var5 = (N_Vector)N_VClone(cv_mem->cv_tempv);
  pCVar1->ca_ytmp = p_Var5;
  iVar10 = 0;
  if (p_Var5 != (N_Vector)0x0) {
    if (pCVar1->ca_IMstoreSensi != 0) {
      pp_Var6 = (N_Vector *)N_VCloneVectorArray(cv_mem->cv_Ns,cv_mem->cv_tempv);
      pCVar1->ca_yStmp = pp_Var6;
      if (pp_Var6 == (N_Vector *)0x0) {
        N_VDestroy(pCVar1->ca_ytmp);
        return 0;
      }
    }
    ppCVar2 = pCVar1->dt_mem;
    uVar9 = (ulong)pCVar1->ca_nsteps >> 0x3f;
    if (-1 < pCVar1->ca_nsteps) {
      lVar8 = 0;
      do {
        __ptr = (long *)malloc(0x18);
        if (__ptr == (long *)0x0) {
LAB_0010daca:
          iVar10 = 0;
          goto LAB_0010dacd;
        }
        lVar7 = N_VClone(cv_mem->cv_tempv);
        *__ptr = lVar7;
        if (lVar7 == 0) {
LAB_0010dac2:
          free(__ptr);
          goto LAB_0010daca;
        }
        if (pCVar1->ca_IMstoreSensi != 0) {
          lVar7 = N_VCloneVectorArray(cv_mem->cv_Ns,cv_mem->cv_tempv);
          __ptr[1] = lVar7;
          if (lVar7 == 0) {
            N_VDestroy(*__ptr);
            goto LAB_0010dac2;
          }
        }
        ppCVar2[lVar8]->content = __ptr;
        uVar9 = (ulong)(pCVar1->ca_nsteps <= lVar8);
        bVar4 = lVar8 < pCVar1->ca_nsteps;
        lVar8 = lVar8 + 1;
      } while (bVar4);
    }
    lVar8 = 0;
    iVar10 = 1;
LAB_0010dacd:
    if (uVar9 == 0) {
      N_VDestroy(pCVar1->ca_ytmp);
      if (pCVar1->ca_IMstoreSensi != 0) {
        N_VDestroyVectorArray(pCVar1->ca_yStmp,cv_mem->cv_Ns);
      }
      if (lVar8 != 0) {
        lVar7 = 0;
        do {
          puVar3 = (undefined8 *)ppCVar2[lVar7]->content;
          N_VDestroy(*puVar3);
          if (pCVar1->ca_IMstoreSensi != 0) {
            N_VDestroyVectorArray(puVar3[1],cv_mem->cv_Ns);
          }
          free(ppCVar2[lVar7]->content);
          ppCVar2[lVar7]->content = (void *)0x0;
          lVar7 = lVar7 + 1;
        } while (lVar8 != lVar7);
      }
    }
  }
  return iVar10;
}

Assistant:

static sunbooleantype CVApolynomialMalloc(CVodeMem cv_mem)
{
  CVadjMem ca_mem;
  CVdtpntMem* dt_mem;
  CVpolynomialDataMem content;
  long int i, ii = 0;
  sunbooleantype allocOK;

  allocOK = SUNTRUE;

  ca_mem = cv_mem->cv_adj_mem;

  /* Allocate space for the vectors ytmp and yStmp */

  ca_mem->ca_ytmp = N_VClone(cv_mem->cv_tempv);
  if (ca_mem->ca_ytmp == NULL) { return (SUNFALSE); }

  if (ca_mem->ca_IMstoreSensi)
  {
    ca_mem->ca_yStmp = N_VCloneVectorArray(cv_mem->cv_Ns, cv_mem->cv_tempv);
    if (ca_mem->ca_yStmp == NULL)
    {
      N_VDestroy(ca_mem->ca_ytmp);
      return (SUNFALSE);
    }
  }

  /* Allocate space for the content field of the dt structures */

  dt_mem = ca_mem->dt_mem;

  for (i = 0; i <= ca_mem->ca_nsteps; i++)
  {
    content = NULL;
    content = (CVpolynomialDataMem)malloc(sizeof(struct CVpolynomialDataMemRec));
    if (content == NULL)
    {
      ii      = i;
      allocOK = SUNFALSE;
      break;
    }

    content->y = N_VClone(cv_mem->cv_tempv);
    if (content->y == NULL)
    {
      free(content);
      content = NULL;
      ii      = i;
      allocOK = SUNFALSE;
      break;
    }

    if (ca_mem->ca_IMstoreSensi)
    {
      content->yS = N_VCloneVectorArray(cv_mem->cv_Ns, cv_mem->cv_tempv);
      if (content->yS == NULL)
      {
        N_VDestroy(content->y);
        free(content);
        content = NULL;
        ii      = i;
        allocOK = SUNFALSE;
        break;
      }
    }

    dt_mem[i]->content = content;
  }

  /* If an error occurred, deallocate and return */

  if (!allocOK)
  {
    N_VDestroy(ca_mem->ca_ytmp);

    if (ca_mem->ca_IMstoreSensi)
    {
      N_VDestroyVectorArray(ca_mem->ca_yStmp, cv_mem->cv_Ns);
    }

    for (i = 0; i < ii; i++)
    {
      content = (CVpolynomialDataMem)(dt_mem[i]->content);
      N_VDestroy(content->y);
      if (ca_mem->ca_IMstoreSensi)
      {
        N_VDestroyVectorArray(content->yS, cv_mem->cv_Ns);
      }
      free(dt_mem[i]->content);
      dt_mem[i]->content = NULL;
    }
  }

  return (allocOK);
}